

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

int64_t cab_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  void *pvVar1;
  wchar_t wVar2;
  ulong uVar3;
  int64_t iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ssize_t avail;
  int64_t local_38;
  
  pvVar1 = a->format->data;
  uVar3 = cab_minimum_consume_cfdata(a,consumed_bytes);
  if (-1 < (long)uVar3) {
    lVar7 = *(long *)((long)pvVar1 + 0x38);
    local_38 = consumed_bytes;
LAB_0013c551:
    do {
      while( true ) {
        if ((long)uVar3 < 1) {
          return local_38;
        }
        if ((ulong)*(ushort *)(lVar7 + 4) == 0) {
          archive_set_error(&a->archive,0x54,"Invalid CFDATA");
          return -0x1e;
        }
        uVar5 = (ulong)*(ushort *)(lVar7 + 10);
        uVar6 = uVar5;
        if (uVar3 < uVar5) {
          uVar6 = uVar3;
        }
        uVar8 = uVar3 - uVar6;
        if ((*(short *)(lVar7 + 0xc) != 0) ||
           ((*(ushort *)(*(long *)((long)pvVar1 + 0x30) + 0x10) | 2) != 0xffff)) break;
        if (uVar3 < uVar5) {
          *(short *)(lVar7 + 0xe) = *(short *)(lVar7 + 0xe) + (short)uVar6;
          *(ushort *)(lVar7 + 10) = *(ushort *)(lVar7 + 10) - (short)uVar6;
          return local_38;
        }
        __archive_read_consume(a,(ulong)*(ushort *)(lVar7 + 4));
        *(long *)((long)pvVar1 + 0x40) =
             *(long *)((long)pvVar1 + 0x40) + (ulong)*(ushort *)(lVar7 + 4);
        *(undefined2 *)(lVar7 + 6) = 0;
        *(undefined2 *)(lVar7 + 10) = 0;
        wVar2 = cab_next_cfdata(a);
        if (wVar2 < L'\0') {
LAB_0013c683:
          return (long)wVar2;
        }
        lVar7 = *(long *)((long)pvVar1 + 0x38);
        uVar3 = uVar8;
        if ((*(short *)(lVar7 + 8) == 0) &&
           (0xfffc < *(ushort *)(*(long *)((long)pvVar1 + 0x30) + 0x10))) {
          uVar3 = 0;
        }
      }
      if (uVar5 != 0) {
        for (; uVar3 = uVar8, 0 < (long)uVar6; uVar6 = uVar6 - avail) {
          cab_read_ahead_cfdata(a,&avail);
          if (avail < 1) {
            return -0x1e;
          }
          if (uVar6 < (ulong)avail) {
            avail = uVar6;
          }
          iVar4 = cab_minimum_consume_cfdata(a,avail);
          if (iVar4 < 0) {
            return -0x1e;
          }
        }
        goto LAB_0013c551;
      }
      wVar2 = cab_next_cfdata(a);
      if (wVar2 < L'\0') goto LAB_0013c683;
      lVar7 = *(long *)((long)pvVar1 + 0x38);
      uVar3 = uVar8;
    } while ((*(short *)(lVar7 + 8) != 0) ||
            (*(ushort *)(*(long *)((long)pvVar1 + 0x30) + 0x10) < 0xfffd));
  }
  return -0x1e;
}

Assistant:

static int64_t
cab_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	rbytes = cab_minimum_consume_cfdata(a, consumed_bytes);
	if (rbytes < 0)
		return (ARCHIVE_FATAL);

	cfdata = cab->entry_cfdata;
	while (rbytes > 0) {
		ssize_t avail;

		if (cfdata->compressed_size == 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid CFDATA");
			return (ARCHIVE_FATAL);
		}
		cbytes = cfdata->uncompressed_bytes_remaining;
		if (cbytes > rbytes)
			cbytes = rbytes;
		rbytes -= cbytes;

		if (cfdata->uncompressed_avail == 0 &&
		   (cab->entry_cffile->folder == iFoldCONTINUED_PREV_AND_NEXT ||
		    cab->entry_cffile->folder == iFoldCONTINUED_FROM_PREV)) {
			/* We have not read any data yet. */
			if (cbytes == cfdata->uncompressed_bytes_remaining) {
				/* Skip whole current CFDATA. */
				__archive_read_consume(a,
				    cfdata->compressed_size);
				cab->cab_offset += cfdata->compressed_size;
				cfdata->compressed_bytes_remaining = 0;
				cfdata->uncompressed_bytes_remaining = 0;
				err = cab_next_cfdata(a);
				if (err < 0)
					return (err);
				cfdata = cab->entry_cfdata;
				if (cfdata->uncompressed_size == 0) {
					switch (cab->entry_cffile->folder) {
					case iFoldCONTINUED_PREV_AND_NEXT:
					case iFoldCONTINUED_TO_NEXT:
					case iFoldCONTINUED_FROM_PREV:
						rbytes = 0;
						break;
					default:
						break;
					}
				}
				continue;
			}
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
			break;
		} else if (cbytes == 0) {
			err = cab_next_cfdata(a);
			if (err < 0)
				return (err);
			cfdata = cab->entry_cfdata;
			if (cfdata->uncompressed_size == 0) {
				switch (cab->entry_cffile->folder) {
				case iFoldCONTINUED_PREV_AND_NEXT:
				case iFoldCONTINUED_TO_NEXT:
				case iFoldCONTINUED_FROM_PREV:
					return (ARCHIVE_FATAL);
				default:
					break;
				}
			}
			continue;
		}
		while (cbytes > 0) {
			(void)cab_read_ahead_cfdata(a, &avail);
			if (avail <= 0)
				return (ARCHIVE_FATAL);
			if (avail > cbytes)
				avail = (ssize_t)cbytes;
			if (cab_minimum_consume_cfdata(a, avail) < 0)
				return (ARCHIVE_FATAL);
			cbytes -= avail;
		}
	}
	return (consumed_bytes);
}